

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_spirv_c.cpp
# Opt level: O2

void dxil_spv_parsed_blob_get_rdat_subobject
               (dxil_spv_parsed_blob blob,uint index,dxil_spv_rdat_subobject *subobject)

{
  pointer pRVar1;
  char **ppcVar2;
  
  pRVar1 = (blob->rdat_subobjects).
           super__Vector_base<dxil_spv::RDATSubobject,_dxil_spv::ThreadLocalAllocator<dxil_spv::RDATSubobject>_>
           ._M_impl.super__Vector_impl_data._M_start;
  subobject->kind = pRVar1[index].kind;
  subobject->subobject_name = pRVar1[index].subobject_name;
  ppcVar2 = pRVar1[index].exports.
            super__Vector_base<const_char_*,_dxil_spv::ThreadLocalAllocator<const_char_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  subobject->exports = ppcVar2;
  subobject->num_exports =
       (uint)((ulong)((long)*(pointer *)
                             ((long)&pRVar1[index].exports.
                                     super__Vector_base<const_char_*,_dxil_spv::ThreadLocalAllocator<const_char_*>_>
                                     ._M_impl + 8) - (long)ppcVar2) >> 3);
  subobject->payload = pRVar1[index].payload;
  subobject->payload_size = pRVar1[index].payload_size;
  subobject->hit_group_type = pRVar1[index].hit_group_type;
  *(undefined8 *)subobject->args = *(undefined8 *)pRVar1[index].args;
  return;
}

Assistant:

void dxil_spv_parsed_blob_get_rdat_subobject(
		dxil_spv_parsed_blob blob, unsigned index, dxil_spv_rdat_subobject *subobject)
{
	auto &sub = blob->rdat_subobjects[index];
	subobject->kind = static_cast<dxil_spv_rdat_subobject_kind>(sub.kind);
	subobject->subobject_name = sub.subobject_name;
	subobject->exports = sub.exports.data();
	subobject->num_exports = unsigned(sub.exports.size());
	subobject->payload = sub.payload;
	subobject->payload_size = sub.payload_size;
	subobject->hit_group_type = static_cast<dxil_spv_hit_group_type>(sub.hit_group_type);
	static_assert(sizeof(subobject->args) == sizeof(sub.args), "Mismatch is args size.");
	memcpy(subobject->args, sub.args, sizeof(sub.args));
}